

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_buffer_block_decorations
          (spvc_compiler compiler,spvc_variable_id id,SpvDecoration **decorations,
          size_t *num_decorations)

{
  undefined4 uVar1;
  spvc_context psVar2;
  char *pcVar3;
  uint *puVar4;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var5;
  SpvDecoration *pSVar6;
  __node_base _Var7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  long lVar12;
  Bitset flags;
  SmallVector<unsigned_int,_8UL> local_e0;
  spvc_compiler local_a8;
  SpvDecoration **local_a0;
  size_t *local_98;
  Bitset local_70;
  
  spirv_cross::Compiler::get_buffer_block_flags
            (&local_70,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id);
  _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x40);
  pSVar6 = (SpvDecoration *)
           ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20)
  ;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_0048fc70;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(SpvDecoration **)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = pSVar6;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  sVar9 = 0;
  uVar11 = 0;
  do {
    if ((local_70.lower >> (uVar11 & 0x3f) & 1) != 0) {
      spirv_cross::SmallVector<SpvDecoration_,_8UL>::reserve
                ((SmallVector<SpvDecoration_,_8UL> *)
                 ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 8),sVar9 + 1);
      pSVar6 = *(SpvDecoration **)
                ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                8);
      lVar10 = *(long *)((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                               _M_head_impl + 0x10);
      pSVar6[lVar10] = (SpvDecoration)uVar11;
      sVar9 = lVar10 + 1;
      *(size_t *)
       ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) =
           sVar9;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x40);
  if (local_70.higher._M_h._M_element_count != 0) {
    local_e0.super_VectorView<unsigned_int>.ptr = (uint *)&local_e0.stack_storage;
    local_e0.super_VectorView<unsigned_int>.buffer_size = 0;
    local_e0.buffer_capacity = 8;
    local_a0 = decorations;
    local_98 = num_decorations;
    spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
              (&local_e0,local_70.higher._M_h._M_element_count);
    if (local_70.higher._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var7._M_nxt = local_70.higher._M_h._M_before_begin._M_nxt;
      do {
        spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                  (&local_e0,local_e0.super_VectorView<unsigned_int>.buffer_size + 1);
        *(undefined4 *)
         ((char *)local_e0.super_VectorView<unsigned_int>.ptr +
         local_e0.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)&_Var7._M_nxt[1]._M_nxt;
        local_e0.super_VectorView<unsigned_int>.buffer_size =
             local_e0.super_VectorView<unsigned_int>.buffer_size + 1;
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
      } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
    }
    puVar4 = local_e0.super_VectorView<unsigned_int>.ptr;
    if (local_e0.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar8 = local_e0.super_VectorView<unsigned_int>.buffer_size * 4;
      pcVar3 = (char *)local_e0.super_VectorView<unsigned_int>.ptr;
      lVar10 = 0x3f;
      if (local_e0.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_e0.super_VectorView<unsigned_int>.buffer_size >> lVar10 == 0;
            lVar10 = lVar10 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_e0.super_VectorView<unsigned_int>.ptr,pcVar3 + lVar8,
                 ((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar4,pcVar3 + lVar8);
      puVar4 = local_e0.super_VectorView<unsigned_int>.ptr;
      if (local_e0.super_VectorView<unsigned_int>.buffer_size != 0) {
        lVar10 = *(long *)((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                 _M_head_impl + 0x10);
        lVar12 = local_e0.super_VectorView<unsigned_int>.buffer_size << 2;
        lVar8 = 0;
        local_a8 = compiler;
        do {
          uVar1 = *(undefined4 *)((char *)puVar4 + lVar8);
          spirv_cross::SmallVector<SpvDecoration_,_8UL>::reserve
                    ((SmallVector<SpvDecoration_,_8UL> *)
                     ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                            _M_head_impl + 8),lVar10 + 1);
          lVar10 = *(long *)((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                   _M_head_impl + 0x10);
          *(undefined4 *)
           (*(long *)((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                            _M_head_impl + 8) + lVar10 * 4) = uVar1;
          lVar10 = lVar10 + 1;
          *(long *)((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl
                   + 0x10) = lVar10;
          lVar8 = lVar8 + 4;
          compiler = local_a8;
        } while (lVar12 != lVar8);
      }
    }
    local_e0.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_e0.super_VectorView<unsigned_int>.ptr !=
        &local_e0.stack_storage) {
      free(local_e0.super_VectorView<unsigned_int>.ptr);
    }
    pSVar6 = *(SpvDecoration **)
              ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8)
    ;
    sVar9 = *(size_t *)
             ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x10);
    num_decorations = local_98;
    decorations = local_a0;
  }
  *decorations = pSVar6;
  *num_decorations = sVar9;
  psVar2 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar2->allocations,
            (psVar2->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar9 = (psVar2->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar9]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar9 + 1;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70.higher._M_h);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_buffer_block_decorations(spvc_compiler compiler, spvc_variable_id id,
                                                       const SpvDecoration **decorations, size_t *num_decorations)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto flags = compiler->compiler->get_buffer_block_flags(id);
		auto bitset = spvc_allocate<TemporaryBuffer<SpvDecoration>>();

		flags.for_each_bit([&](uint32_t bit) { bitset->buffer.push_back(static_cast<SpvDecoration>(bit)); });

		*decorations = bitset->buffer.data();
		*num_decorations = bitset->buffer.size();
		compiler->context->allocations.push_back(std::move(bitset));
	}